

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

APInt * __thiscall llvm::APInt::operator|=(APInt *this,uint64_t RHS)

{
  bool bVar1;
  uint64_t RHS_local;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if (bVar1) {
    (this->U).VAL = RHS | (this->U).VAL;
    clearUnusedBits(this);
  }
  else {
    *(this->U).pVal = RHS | *(this->U).pVal;
  }
  return this;
}

Assistant:

APInt &operator|=(uint64_t RHS) {
    if (isSingleWord()) {
      U.VAL |= RHS;
      clearUnusedBits();
    } else {
      U.pVal[0] |= RHS;
    }
    return *this;
  }